

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

request_t * new_request(bsc_step_t step)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  request_t *prVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  bool bVar19;
  byte bVar20;
  int local_60;
  
  bVar20 = 0;
  if (step < bsc_s_bsc) {
    bsp_abort("bsc: a flush sync is required before posting another request. Requested superstep %d comes before current step %d\n"
              ,(ulong)step);
  }
  uVar17 = step - bsc_s_bsc;
  uVar11 = (ulong)DAT_0012038c;
  if ((DAT_0012038c <= uVar17) ||
     (DAT_00120390 <=
      *(uint *)((long)DAT_00120398 + ((ulong)(DAT_00120394 + uVar17) % (ulong)DAT_0012038c) * 4))) {
    uVar12 = uVar17 + 1;
    if (uVar17 + 1 < DAT_0012038c * 2) {
      uVar12 = DAT_0012038c * 2;
    }
    uVar2 = DAT_0012038c;
    if (DAT_0012038c <= uVar17) {
      uVar2 = uVar12;
    }
    uVar11 = (ulong)uVar2;
    if (uVar2 <= uVar17) {
      bsp_abort("bsc: cannot plan that far in the futuredue to integer overflow\n");
    }
    pvVar5 = calloc(uVar11,4);
    if (pvVar5 == (void *)0x0) {
      bsp_abort("bsc: insufficient memory; cannot allocate %u x %u bytes\n",uVar11,4);
    }
    pvVar4 = DAT_00120398;
    iVar10 = DAT_00120394;
    uVar12 = DAT_0012038c;
    uVar8 = (ulong)DAT_0012038c;
    local_60 = DAT_00120394;
    for (uVar13 = 0; uVar13 < uVar8; uVar13 = uVar13 + 1) {
      *(undefined4 *)((long)pvVar5 + uVar13 * 4) =
           *(undefined4 *)((long)pvVar4 + ((ulong)(uint)(iVar10 + (int)uVar13) % uVar8) * 4);
    }
    uVar1 = *(uint *)((long)pvVar5 + (ulong)uVar17 * 4);
    uVar3 = uVar1 + 1;
    if (uVar1 + 1 < DAT_00120390 * 2) {
      uVar3 = DAT_00120390 * 2;
    }
    if (uVar1 < DAT_00120390) {
      uVar3 = DAT_00120390;
    }
    if (uVar3 <= uVar1) {
      bsp_abort("bsc: cannot plan that far in the futuredue to integer overflow\n");
      local_60 = DAT_00120394;
      uVar12 = DAT_0012038c;
    }
    uVar1 = DAT_00120390;
    pvVar6 = calloc(uVar3 * uVar11,0x58);
    pvVar4 = DAT_001203a0;
    uVar8 = 0;
    for (uVar18 = 0; uVar18 != uVar12; uVar18 = uVar18 + 1) {
      iVar10 = 0;
      uVar13 = (ulong)uVar1;
      uVar16 = uVar8;
      while (bVar19 = uVar13 != 0, uVar13 = uVar13 - 1, bVar19) {
        puVar14 = (undefined8 *)
                  ((ulong)(((local_60 + uVar18) % uVar12) * uVar1 + iVar10) * 0x58 + (long)pvVar4);
        puVar15 = (undefined8 *)(uVar16 * 0x58 + (long)pvVar6);
        for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar15 = *puVar14;
          puVar14 = puVar14 + (ulong)bVar20 * -2 + 1;
          puVar15 = puVar15 + (ulong)bVar20 * -2 + 1;
        }
        iVar10 = iVar10 + 1;
        uVar16 = (ulong)((int)uVar16 + 1);
      }
      uVar8 = (ulong)((int)uVar8 + uVar3);
    }
    free(DAT_00120398);
    free(DAT_001203a0);
    DAT_00120394 = 0;
    DAT_0012038c = uVar2;
    DAT_00120390 = uVar3;
    DAT_00120398 = pvVar5;
    DAT_001203a0 = pvVar6;
  }
  uVar11 = (ulong)(DAT_00120394 + uVar17) % uVar11;
  uVar17 = *(uint *)((long)DAT_00120398 + uVar11 * 4);
  prVar7 = (request_t *)
           ((long)DAT_001203a0 + (ulong)uVar17 * 0x58 + (ulong)(DAT_00120390 * (int)uVar11) * 0x58);
  *(uint *)((long)DAT_00120398 + uVar11 * 4) = uVar17 + 1;
  DAT_001203a8 = DAT_001203a8 + 1;
  return prVar7;
}

Assistant:

static request_t * new_request( bsc_step_t step ) 
{
    unsigned i, j, delay;
    request_t * entry;
    state_t * const sbsc = bsc();

    if ( step < sbsc->current )
        bsp_abort("bsc: a flush sync is required before posting"
                  " another request. Requested superstep %d comes before current step %d\n",
                  step, sbsc->current );

    delay = step - sbsc->current;
    if ( delay >= sbsc->horizon || 
          sbsc->n_requests[ (sbsc->queue_start + delay) % sbsc->horizon ] 
            >= sbsc->max_requests_per_step ) {

        /* new memory allocation is necessary */
        bsc_step_t new_horizon;
        unsigned * new_n_requests;
        unsigned new_max_requests;
        request_t * new_queue;

        new_horizon = sbsc->horizon;
        if (delay >= sbsc->horizon) {
            new_horizon = MAX( 2*sbsc->horizon, delay + 1);
        }

        if ( new_horizon <= delay )
            bsp_abort("bsc: cannot plan that far in the future"
                      "due to integer overflow\n");
        
        new_n_requests = calloc( new_horizon, sizeof(unsigned));
        if ( ! new_n_requests ) 
            bsp_abort("bsc: insufficient memory; "
                      "cannot allocate %u x %u bytes\n",
                new_horizon, (unsigned) sizeof(unsigned) );

        for ( i = 0; i < sbsc->horizon; ++i ) {
            j = (sbsc->queue_start + i) % sbsc->horizon;
            new_n_requests[ i ] = sbsc->n_requests[j];
        }

        new_max_requests = sbsc->max_requests_per_step; 
        if (new_max_requests <= new_n_requests[delay]) 
            new_max_requests = MAX( 2 * sbsc->max_requests_per_step, 
                    new_n_requests[delay] + 1  );

        if ( new_max_requests <= new_n_requests[delay] )
            bsp_abort("bsc: cannot plan that far in the future"
                      "due to integer overflow\n");
     
        new_queue = calloc( (size_t) new_horizon * new_max_requests, 
                            sizeof(request_t) );

        for ( i = 0; i < sbsc->horizon; ++i ) {
            for ( j = 0; j < sbsc->max_requests_per_step; ++j ){
                unsigned a = i * new_max_requests + j;
                unsigned b = (i + sbsc->queue_start) % sbsc->horizon 
                              * sbsc->max_requests_per_step + j;
                new_queue[ a ] = sbsc->queue[ b ];
            }
        }

        free( sbsc->n_requests );
        free( sbsc->queue );
        sbsc->n_requests = new_n_requests;
        sbsc->queue = new_queue;
        sbsc->horizon = new_horizon;
        sbsc->max_requests_per_step = new_max_requests;
        sbsc->queue_start = 0;
    }

    i = (delay + sbsc->queue_start) % sbsc->horizon;
    entry = sbsc->queue + i * 
        sbsc->max_requests_per_step + sbsc->n_requests[i] ;
    
    sbsc->n_requests[i] += 1;
    sbsc->total_n_outstanding_requests += 1;

    return entry;
}